

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pageReinit(DbPage *pData)

{
  int iVar1;
  char *pcVar2;
  MemPage *in_RDI;
  MemPage *pPage;
  
  pcVar2 = (char *)sqlite3PagerGetExtra((DbPage *)in_RDI);
  if (*pcVar2 != '\0') {
    *pcVar2 = '\0';
    iVar1 = sqlite3PagerPageRefcount((DbPage *)0x15a497);
    if (1 < iVar1) {
      btreeInitPage(in_RDI);
    }
  }
  return;
}

Assistant:

static void pageReinit(DbPage *pData){
  MemPage *pPage;
  pPage = (MemPage *)sqlite3PagerGetExtra(pData);
  assert( sqlite3PagerPageRefcount(pData)>0 );
  if( pPage->isInit ){
    assert( sqlite3_mutex_held(pPage->pBt->mutex) );
    pPage->isInit = 0;
    if( sqlite3PagerPageRefcount(pData)>1 ){
      /* pPage might not be a btree page;  it might be an overflow page
      ** or ptrmap page or a free page.  In those cases, the following
      ** call to btreeInitPage() will likely return SQLITE_CORRUPT.
      ** But no harm is done by this.  And it is very important that
      ** btreeInitPage() be called on every btree page so we make
      ** the call for every page that comes in for re-initializing. */
      btreeInitPage(pPage);
    }
  }
}